

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O0

ssize_t wrapped_write(int fd,void *buf,size_t count)

{
  long lVar1;
  code *pcVar2;
  ssize_t local_70;
  curious_write_record_t io_args;
  curious_file_record_t *record;
  char *mount_point;
  char *filesystem;
  write_f orig_write;
  size_t count_local;
  void *buf_local;
  ssize_t sStack_10;
  int fd_local;
  
  lVar1 = __tls_get_addr(&PTR_00550710);
  *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + 1;
  pcVar2 = (code *)gotcha_get_wrappee(io_fns[1].handle);
  lVar1 = __tls_get_addr(&PTR_00550710);
  if ((*(int *)(lVar1 + 0xc) == 1) && (wrappers_enabled != 0)) {
    io_args._32_8_ = get_curious_file_record(fd);
    if ((curious_file_record_t *)io_args._32_8_ == (curious_file_record_t *)0x0) {
      mount_point = (char *)0x0;
      record = (curious_file_record_t *)0x0;
    }
    else {
      mount_point = ((curious_file_record_t *)io_args._32_8_)->filesystem;
      record = (curious_file_record_t *)((curious_file_record_t *)io_args._32_8_)->mount_point;
    }
    local_70 = 0;
    io_args.bytes_written._0_4_ = 0;
    io_args._8_8_ = mount_point;
    io_args.filesystem = (char *)record;
    io_args.mount_point._0_4_ = 1;
    curious_call_callbacks(2,&local_70);
    local_70 = (*pcVar2)(fd,buf,count);
    io_args.bytes_written._0_4_ = 1;
    curious_call_callbacks(3,&local_70);
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
    sStack_10 = local_70;
  }
  else {
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
    sStack_10 = (*pcVar2)(fd,buf,count);
  }
  return sStack_10;
}

Assistant:

ssize_t wrapped_write(int fd, const void* buf, size_t count)
{
    WRAPPER_ENTER(write);

    // Get the handle for the original function
    write_f orig_write = (write_f) gotcha_get_wrappee(io_fns[CURIOUS_WRITE_ID].handle);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        char*                  filesystem;
        char*                  mount_point;
        curious_file_record_t* record = get_curious_file_record(fd);
        if (NULL == record) {
            filesystem  = NULL;
            mount_point = NULL;
        } else {
            filesystem  = record->filesystem;
            mount_point = record->mount_point;
        }

        curious_write_record_t io_args = {
            .bytes_written = 0,
            .call_count    = 0,
            .filesystem    = filesystem,
            .mount_point   = mount_point,
            .function_id   = CURIOUS_WRITE_ID,
        };
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK, &io_args);

        // Call the original, saving the result...
        io_args.bytes_written = orig_write(fd, buf, count);
        io_args.call_count    = 1;

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(io_args.bytes_written, write);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_write(fd, buf, count), write);
    }
}